

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  rawSeq *prVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  uint minMatch;
  uint uVar4;
  uint uVar5;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar6;
  long lVar7;
  BYTE *pBVar8;
  seqDef *psVar9;
  BYTE *pBVar10;
  ulong uVar12;
  ulong uVar13;
  ZSTD_dictMode_e dictMode;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  U32 UVar11;
  
  if ((ms->window).lowLimit < (ms->window).dictLimit) {
    dictMode = ZSTD_extDict;
  }
  else {
    dictMode = (uint)(ms->dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE = ZSTD_selectBlockCompressor((ms->cParams).strategy,dictMode);
  pBVar3 = (BYTE *)(srcSize + (long)src);
  while( true ) {
    uVar12 = rawSeqStore->pos;
    uVar15 = (long)pBVar3 - (long)src;
    if ((rawSeqStore->size <= uVar12) || (pBVar3 <= src)) break;
    prVar1 = rawSeqStore->seq + uVar12;
    uVar13._0_4_ = prVar1->offset;
    uVar13._4_4_ = prVar1->litLength;
    uVar16 = uVar13 >> 0x20;
    uVar4 = rawSeqStore->seq[uVar12].matchLength;
    uVar14 = (uint)uVar15;
    if (uVar14 < uVar4 + uVar13._4_4_) {
      uVar12 = uVar13;
      if (uVar14 - uVar13._4_4_ < minMatch) {
        uVar12 = 0;
      }
      uVar5 = uVar14 - uVar13._4_4_;
      if (uVar14 < (uint)uVar13._4_4_ || uVar14 - uVar13._4_4_ == 0) {
        uVar12 = 0;
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      ZSTD_ldm_skipSequences(rawSeqStore,uVar15 & 0xffffffff,minMatch);
      uVar13 = uVar12;
    }
    else {
      rawSeqStore->pos = uVar12 + 1;
    }
    UVar11 = (U32)uVar13;
    if (UVar11 == 0) break;
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
    ZSTD_ldm_fillFastTables(ms,src);
    sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar16);
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -4) {
      *(undefined4 *)((long)rep + lVar7) = *(undefined4 *)((long)rep + lVar7 + -4);
    }
    *rep = UVar11;
    pBVar8 = (BYTE *)((long)src + (uVar16 - sVar6));
    pBVar10 = seqStore->lit;
    pBVar2 = pBVar10 + sVar6;
    do {
      *(undefined8 *)pBVar10 = *(undefined8 *)pBVar8;
      pBVar10 = pBVar10 + 8;
      pBVar8 = pBVar8 + 8;
    } while (pBVar10 < pBVar2);
    seqStore->lit = seqStore->lit + sVar6;
    if (sVar6 < 0x10000) {
      psVar9 = seqStore->sequences;
    }
    else {
      seqStore->longLengthID = 1;
      psVar9 = seqStore->sequences;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar9->litLength = (U16)sVar6;
    psVar9->offset = UVar11 + 3;
    if (0xffff < uVar4 - 3) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar9->matchLength = (U16)(uVar4 - 3);
    seqStore->sequences = psVar9 + 1;
    src = (void *)((long)src + uVar4 + uVar16);
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
  ZSTD_ldm_fillFastTables(ms,src);
  sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar15);
  return sVar6;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}